

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

int find_conflict_base(int cbase)

{
  Yshort *pYVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (0 < cbase) {
    uVar2 = 0;
    pYVar1 = conflicts;
    do {
      if (nconflicts <= cbase) {
LAB_00111f60:
        return (int)uVar2;
      }
      uVar3 = 0;
      while (pYVar1[uVar3] == conflicts[(uint)cbase + uVar3]) {
        uVar3 = uVar3 + 1;
        if ((uint)(nconflicts - cbase) == uVar3) goto LAB_00111f60;
      }
      uVar2 = uVar2 + 1;
      pYVar1 = pYVar1 + 1;
    } while (uVar2 != (uint)cbase);
  }
  return cbase;
}

Assistant:

int find_conflict_base(int cbase)
{
    int i,j;

    for (i=0; i<cbase; i++) {
	for (j=0; j+cbase < nconflicts; j++) {
	    if (conflicts[i+j] != conflicts[cbase+j])
		break; }
	if (j+cbase >= nconflicts)
	    return i; }
    return cbase;
}